

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

avector<Vec3ff> * __thiscall
embree::XMLLoader::loadVec3ffArray(XMLLoader *this,Ref<embree::XML> *xml)

{
  Vec3fx *pVVar1;
  undefined8 uVar2;
  ulong uVar3;
  byte bVar4;
  size_type sVar5;
  runtime_error *this_00;
  ulong uVar6;
  unsigned_long *puVar7;
  Vec3fx *pVVar8;
  long *in_RDX;
  avector<Vec3ff> *in_RDI;
  float fVar9;
  float fVar10;
  float fVar11;
  size_t i_4;
  avector<Vec3ff> *data;
  size_t i_6;
  size_t i_5;
  size_t i_3;
  size_t i_2;
  Vec3fx *old_items;
  size_t i_1;
  size_t i;
  size_t new_size_alloced;
  char *in_stack_fffffffffffffc68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb4;
  XML *in_stack_fffffffffffffcb8;
  Token *pTVar12;
  undefined1 cast;
  Token *this_01;
  undefined7 in_stack_fffffffffffffd18;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  Token *local_2a0;
  undefined1 local_291;
  string local_270 [35];
  undefined1 local_24d;
  allocator local_239;
  string local_238 [32];
  string local_218 [32];
  long *local_1f8;
  long *local_1e0;
  long *local_1d8;
  long *local_1d0;
  long *local_1c8;
  long *local_1c0;
  long *local_1b8;
  long *local_1b0;
  float local_1a0;
  float local_19c;
  float local_198;
  float local_194;
  undefined8 *local_190;
  ulong local_170;
  Token *local_158;
  undefined8 *local_148;
  Vec3fx *local_140;
  undefined8 local_128;
  undefined8 uStack_120;
  float local_118;
  float local_114;
  float local_110;
  float local_10c;
  Ref<embree::XML> *in_stack_fffffffffffffef8;
  XMLLoader *in_stack_ffffffffffffff00;
  ulong local_b8;
  ulong local_b0;
  ulong local_a0;
  ulong local_98;
  unsigned_long local_30 [2];
  ulong local_20;
  ulong local_18;
  ulong local_8;
  
  if (*in_RDX == 0) {
    in_RDI->size_active = 0;
    in_RDI->size_alloced = 0;
    in_RDI->items = (Vec3fx *)0x0;
  }
  else {
    local_1f8 = in_RDX;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_238,"ofs",&local_239);
    XML::parm(in_stack_fffffffffffffcb8,
              (string *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
    bVar4 = std::operator!=(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    std::__cxx11::string::~string(local_218);
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::~allocator((allocator<char> *)&local_239);
    if ((bVar4 & 1) == 0) {
      local_24d = 0;
      in_RDI->size_active = 0;
      in_RDI->size_alloced = 0;
      in_RDI->items = (Vec3fx *)0x0;
      local_1b0 = local_1f8;
      sVar5 = std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                        ((vector<embree::Token,_std::allocator<embree::Token>_> *)
                         (*local_1f8 + 0x98));
      if ((sVar5 & 3) != 0) {
        local_291 = 1;
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_1b8 = local_1f8;
        ParseLocation::str_abi_cxx11_((ParseLocation *)CONCAT17(bVar4,in_stack_fffffffffffffd18));
        std::operator+(in_stack_fffffffffffffc78,(char *)in_stack_fffffffffffffc70);
        std::runtime_error::runtime_error(this_00,local_270);
        local_291 = 0;
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_1c0 = local_1f8;
      sVar5 = std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                        ((vector<embree::Token,_std::allocator<embree::Token>_> *)
                         (*local_1f8 + 0x98));
      uVar6 = sVar5 >> 2;
      local_170 = uVar6;
      local_18 = uVar6;
      if (in_RDI->size_alloced < uVar6) {
        local_8 = uVar6;
        if (in_RDI->size_alloced != 0) {
          local_20 = in_RDI->size_alloced;
          while (local_20 < local_18) {
            local_30[1] = 1;
            local_30[0] = local_20 << 1;
            puVar7 = std::max<unsigned_long>(local_30 + 1,local_30);
            local_20 = *puVar7;
          }
          local_8 = local_20;
        }
      }
      else {
        local_8 = in_RDI->size_alloced;
      }
      uVar3 = local_8;
      local_98 = uVar6;
      if (uVar6 < in_RDI->size_active) {
        for (; local_98 < in_RDI->size_active; local_98 = local_98 + 1) {
        }
        in_RDI->size_active = uVar6;
      }
      if (local_8 == in_RDI->size_alloced) {
        for (local_a0 = in_RDI->size_active; local_a0 < uVar6; local_a0 = local_a0 + 1) {
        }
        in_RDI->size_active = uVar6;
      }
      else {
        pVVar1 = in_RDI->items;
        pVVar8 = (Vec3fx *)
                 alignedMalloc((size_t)in_stack_fffffffffffffc78,(size_t)in_stack_fffffffffffffc70);
        in_RDI->items = pVVar8;
        for (local_b0 = 0; local_b0 < in_RDI->size_active; local_b0 = local_b0 + 1) {
          pVVar8 = in_RDI->items;
          uVar2 = *(undefined8 *)((long)&pVVar1[local_b0].field_0 + 8);
          *(undefined8 *)&pVVar8[local_b0].field_0 = *(undefined8 *)&pVVar1[local_b0].field_0;
          *(undefined8 *)((long)&pVVar8[local_b0].field_0 + 8) = uVar2;
        }
        for (local_b8 = in_RDI->size_active; local_b8 < uVar6; local_b8 = local_b8 + 1) {
        }
        alignedFree(in_stack_fffffffffffffc68);
        in_RDI->size_active = uVar6;
        in_RDI->size_alloced = uVar3;
      }
      for (local_2a0 = (Token *)0x0; this_01 = (Token *)in_RDI->size_active, local_2a0 < this_01;
          local_2a0 = (Token *)((long)&local_2a0->ty + 1)) {
        local_1c8 = local_1f8;
        pTVar12 = local_2a0;
        std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
                  ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_1f8 + 0x98),
                   (long)local_2a0 << 2);
        cast = (undefined1)((ulong)pTVar12 >> 0x38);
        fVar9 = Token::Float(this_01,(bool)cast);
        local_1d0 = local_1f8;
        std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
                  ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_1f8 + 0x98),
                   (long)local_2a0 * 4 + 1);
        fVar10 = Token::Float(this_01,(bool)cast);
        local_1d8 = local_1f8;
        std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
                  ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_1f8 + 0x98),
                   (long)local_2a0 * 4 + 2);
        fVar11 = Token::Float(this_01,(bool)cast);
        local_1e0 = local_1f8;
        std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
                  ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_1f8 + 0x98),
                   (long)local_2a0 * 4 + 3);
        local_1a0 = Token::Float(this_01,(bool)cast);
        local_190 = &local_2b8;
        local_128 = CONCAT44(fVar10,fVar9);
        uStack_120 = CONCAT44(local_1a0,fVar11);
        local_158 = local_2a0;
        local_140 = in_RDI->items + (long)local_2a0;
        local_148 = &local_2b8;
        *(undefined8 *)&local_140->field_0 = local_128;
        *(undefined8 *)((long)&local_140->field_0 + 8) = uStack_120;
        local_19c = fVar11;
        local_198 = fVar10;
        local_194 = fVar9;
        local_118 = fVar9;
        local_114 = fVar10;
        local_110 = fVar11;
        local_10c = local_1a0;
        local_2b8 = local_128;
        uStack_2b0 = uStack_120;
      }
    }
    else {
      loadBinary<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    }
  }
  return in_RDI;
}

Assistant:

avector<Vec3ff> XMLLoader::loadVec3ffArray(const Ref<XML>& xml)
  {
    if (!xml) return avector<Vec3ff>();

    if (xml->parm("ofs") != "") {
      return loadBinary<avector<Vec3ff>>(xml);
    } 
    else 
    {
      avector<Vec3ff> data;
      if (xml->body.size() % 4 != 0) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong vector<float4> body");
      data.resize(xml->body.size()/4);
      for (size_t i=0; i<data.size(); i++) 
        data[i] = Vec3ff(xml->body[4*i+0].Float(),xml->body[4*i+1].Float(),xml->body[4*i+2].Float(),xml->body[4*i+3].Float());
      return data;
    }
  }